

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

bool __thiscall YAML::Utils::WriteTag(Utils *this,ostream_wrapper *out,string *str,bool verbatim)

{
  RegEx *this_00;
  pointer pRVar1;
  int iVar2;
  int iVar3;
  RegEx *this_01;
  pointer pcVar4;
  undefined7 in_register_00000009;
  char *__n;
  void *__buf;
  uint uVar5;
  char *pcVar6;
  pointer pRVar7;
  char cVar8;
  RegEx *param;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  StringCharSource buffer;
  char local_59;
  StringCharSource local_58;
  uint local_34;
  
  __n = (char *)CONCAT71(in_register_00000009,verbatim);
  uVar10 = (ulong)str & 0xffffffff;
  cVar8 = (char)uVar10;
  pcVar6 = "!";
  if ((uint)str != 0) {
    pcVar6 = "!<";
  }
  local_58.m_str = (char *)&local_58.m_offset;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,pcVar6,pcVar6 + ((ulong)str & 0xffffffff) + 1);
  ostream_wrapper::write((ostream_wrapper *)this,(int)&local_58,__buf,(size_t)__n);
  if ((size_t *)local_58.m_str != &local_58.m_offset) {
    operator_delete(local_58.m_str);
  }
  local_58.m_str =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  pcVar4 = (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58.m_offset = 0;
  local_58.m_size = (size_t)pcVar4;
  if (cVar8 == '\0') {
    this_01 = Exp::Tag();
  }
  else {
    this_01 = Exp::URI();
  }
  bVar11 = pcVar4 == (pointer)0x0;
  if (!bVar11) {
    pcVar4 = (pointer)0x0;
    local_34 = (uint)str;
    do {
      switch(this_01->m_op) {
      case REGEX_MATCH:
        iVar3 = 1;
        if (local_58.m_str[(long)pcVar4] != this_01->m_a) {
          return bVar11;
        }
        break;
      case REGEX_RANGE:
        if (local_58.m_str[(long)pcVar4] < this_01->m_a) {
          return bVar11;
        }
        iVar3 = 1;
        if (this_01->m_z < local_58.m_str[(long)pcVar4]) {
          return bVar11;
        }
        break;
      case REGEX_OR:
        pRVar7 = (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pRVar1 = (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          if (pRVar7 == pRVar1) {
            return bVar11;
          }
          iVar3 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar7,&local_58);
          if (-1 < iVar3) break;
          pRVar7 = pRVar7 + 1;
        }
        goto LAB_0070a424;
      case REGEX_AND:
        pRVar7 = (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
            _M_impl.super__Vector_impl_data._M_finish == pRVar7) {
          return bVar11;
        }
        iVar3 = -1;
        lVar9 = 0;
        uVar10 = 0;
        do {
          iVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>
                            ((RegEx *)((long)&pRVar7->m_op + lVar9),&local_58);
          if (iVar2 == -1) {
            return bVar11;
          }
          if (uVar10 == 0) {
            iVar3 = iVar2;
          }
          uVar10 = uVar10 + 1;
          pRVar7 = (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (ulong)((long)(this_01->m_params).
                                        super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7 >>
                                 5));
        goto LAB_0070a424;
      case REGEX_NOT:
        this_00 = (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (this_00 ==
            (this_01->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return bVar11;
        }
        iVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>(this_00,&local_58);
        iVar3 = 1;
        if (-1 < iVar2) {
          return bVar11;
        }
        break;
      case REGEX_SEQ:
        iVar3 = RegEx::MatchOpSeq<YAML::StringCharSource>(this_01,&local_58);
LAB_0070a424:
        uVar10 = (ulong)local_34;
        if (iVar3 < 1) {
          return bVar11;
        }
        break;
      default:
        goto switchD_0070a31e_default;
      }
      cVar8 = (char)uVar10;
      uVar5 = iVar3 + 1;
      do {
        local_59 = local_58.m_str[local_58.m_offset];
        __n = local_58.m_str;
        ostream_wrapper::write
                  ((ostream_wrapper *)this,(int)&local_59,(void *)0x1,(size_t)local_58.m_str);
        pcVar4 = (pointer)(local_58.m_offset + 1);
        uVar5 = uVar5 - 1;
        local_58.m_offset = (size_t)pcVar4;
      } while (1 < uVar5);
      bVar11 = pcVar4 >= local_58.m_size;
    } while (pcVar4 < local_58.m_size);
  }
  if (cVar8 != '\0') {
    ostream_wrapper::write((ostream_wrapper *)this,0x74264b,(void *)0x1,(size_t)__n);
  }
switchD_0070a31e_default:
  return bVar11;
}

Assistant:

bool WriteTag(ostream_wrapper& out, const std::string& str, bool verbatim) {
  out << (verbatim ? "!<" : "!");
  StringCharSource buffer(str.c_str(), str.size());
  const RegEx& reValid = verbatim ? Exp::URI() : Exp::Tag();
  while (buffer) {
    int n = reValid.Match(buffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << buffer[0];
      ++buffer;
    }
  }
  if (verbatim) {
    out << ">";
  }
  return true;
}